

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O0

unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_> __thiscall
wabt::MakeUnique<wabt::TypeModuleField,wabt::Location>(wabt *this,Location *args)

{
  TypeModuleField *this_00;
  Location *args_local;
  
  this_00 = (TypeModuleField *)operator_new(0x48);
  TypeModuleField::TypeModuleField(this_00,args);
  std::unique_ptr<wabt::TypeModuleField,std::default_delete<wabt::TypeModuleField>>::
  unique_ptr<std::default_delete<wabt::TypeModuleField>,void>
            ((unique_ptr<wabt::TypeModuleField,std::default_delete<wabt::TypeModuleField>> *)this,
             this_00);
  return (__uniq_ptr_data<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>,_true,_true>
          )(__uniq_ptr_data<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}